

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O2

Option * __thiscall CLI::Option::requires<CLI::App>(Option *this,string *opt_name)

{
  pointer puVar1;
  bool bVar2;
  Option *pOVar3;
  IncorrectConstruction *__return_storage_ptr__;
  pointer puVar4;
  string local_70;
  string local_50;
  
  puVar4 = (this->parent_->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->parent_->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar4 == puVar1) {
      __return_storage_ptr__ = (IncorrectConstruction *)__cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string((string *)&local_70,(string *)opt_name);
      IncorrectConstruction::MissingOption(__return_storage_ptr__,&local_70);
      __cxa_throw(__return_storage_ptr__,&IncorrectConstruction::typeinfo,Error::~Error);
    }
    pOVar3 = (puVar4->_M_t).super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>.
             _M_t.super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    if (pOVar3 != this) {
      ::std::__cxx11::string::string((string *)&local_50,(string *)opt_name);
      bVar2 = check_name(pOVar3,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      if (bVar2) {
        pOVar3 = requires(this,(puVar4->_M_t).
                               super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>
                               .super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
        return pOVar3;
      }
    }
    puVar4 = puVar4 + 1;
  } while( true );
}

Assistant:

Option *requires(std::string opt_name) {
        for(const Option_p &opt : dynamic_cast<T *>(parent_)->options_)
            if(opt.get() != this && opt->check_name(opt_name))
                return requires(opt.get());
        throw IncorrectConstruction::MissingOption(opt_name);
    }